

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Bt3_MatchFinder_Skip(void *_p,UInt32 num)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  undefined4 uVar1;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  UInt32 pos1;
  UInt32 temp;
  UInt32 *hash;
  UInt32 h2;
  UInt32 lenLimit;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  CMatchFinder *p;
  UInt32 num_local;
  void *_p_local;
  
  p._4_4_ = num;
  do {
    lenLimit_00 = *(uint *)((long)_p + 0x14);
    if (lenLimit_00 < 3) {
      MatchFinder_MovePos((CMatchFinder *)_p);
    }
    else {
      pbVar2 = *_p;
      uVar4 = *(uint *)((long)_p + (ulong)*pbVar2 * 4 + 0x78) ^ (uint)pbVar2[1];
      uVar5 = (uVar4 ^ (uint)pbVar2[2] << 8) & *(uint *)((long)_p + 0x38);
      lVar3 = *(long *)((long)_p + 0x28);
      curMatch_00 = *(UInt32 *)(lVar3 + 0x1000 + (ulong)uVar5 * 4);
      uVar1 = *(undefined4 *)((long)_p + 8);
      *(undefined4 *)(lVar3 + 0x1000 + (ulong)uVar5 * 4) = uVar1;
      *(undefined4 *)(lVar3 + (ulong)(uVar4 & 0x3ff) * 4) = uVar1;
      SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)((long)_p + 8),*_p,
                      *(CLzRef **)((long)_p + 0x30),(ulong)*(uint *)((long)_p + 0x18),
                      *(UInt32 *)((long)_p + 0x1c),*(UInt32 *)((long)_p + 0x3c));
      *(int *)((long)_p + 0x18) = *(int *)((long)_p + 0x18) + 1;
      *(long *)_p = *_p + 1;
      iVar6 = *(int *)((long)_p + 8) + 1;
      *(int *)((long)_p + 8) = iVar6;
      if (iVar6 == *(int *)((long)_p + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)_p);
      }
    }
    p._4_4_ = p._4_4_ - 1;
  } while (p._4_4_ != 0);
  return;
}

Assistant:

static void Bt3_MatchFinder_Skip(void *_p, UInt32 num)
{
  CMatchFinder *p = (CMatchFinder *)_p;
  SKIP_HEADER(3)
  {
    UInt32 h2;
    UInt32 *hash;
    HASH3_CALC
    hash = p->hash;
    curMatch = (hash + kFix3HashSize)[hv];
    hash[h2] =
    (hash + kFix3HashSize)[hv] = p->pos;
  }
  SKIP_FOOTER
}